

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O0

string * adios2::helper::FileToString(string *fileName,string *hint)

{
  byte bVar1;
  streambuf *psVar2;
  string *in_RSI;
  string *in_RDI;
  ostringstream fileSS;
  ifstream fileStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  string *in_stack_fffffffffffffb88;
  string *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffba0;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [39];
  undefined1 local_2a1 [40];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [48];
  long local_220 [68];
  
  std::ifstream::ifstream(local_220,in_RSI,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"Helper",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"adiosString",&local_279);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_2a1 + 1),"FileToString",(allocator *)__lhs);
    std::operator+((char *)in_stack_fffffffffffffb88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    std::operator+(__lhs,(char *)in_stack_fffffffffffffb40);
    std::operator+(__lhs,in_stack_fffffffffffffb40);
    Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88,in_stack_fffffffffffffb84);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string((string *)(local_2a1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2a1);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffb80);
  psVar2 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(&stack0xfffffffffffffb80,psVar2);
  std::ifstream::close();
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffb80);
  std::ifstream::~ifstream(local_220);
  return in_RDI;
}

Assistant:

std::string FileToString(const std::string &fileName, const std::string hint)
{
    std::ifstream fileStream(fileName);

    if (!fileStream)
    {
        helper::Throw<std::ios_base::failure>("Helper", "adiosString", "FileToString",
                                              "file " + fileName + " not found, " + hint);
    }

    std::ostringstream fileSS;
    fileSS << fileStream.rdbuf();
    fileStream.close();
    return fileSS.str();
}